

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
          (string *__return_storage_ptr__,XmlUnitTestResultPrinter *this,TestResult *result)

{
  int iVar1;
  int iVar2;
  Message *pMVar3;
  char *__s;
  allocator<char> local_89;
  string local_88;
  string local_68;
  char *local_48 [3];
  TestProperty *local_30;
  TestProperty *property;
  int i;
  Message attributes;
  TestResult *result_local;
  
  attributes.ss_.ptr_ =
       (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )this;
  Message::Message((Message *)&stack0xffffffffffffffe0);
  property._4_4_ = 0;
  while( true ) {
    iVar1 = property._4_4_;
    iVar2 = TestResult::test_property_count((TestResult *)attributes.ss_.ptr_);
    if (iVar2 <= iVar1) break;
    local_30 = TestResult::GetTestProperty((TestResult *)attributes.ss_.ptr_,property._4_4_);
    pMVar3 = Message::operator<<((Message *)&stack0xffffffffffffffe0,(char (*) [2])0x219e52);
    local_48[0] = TestProperty::key(local_30);
    pMVar3 = Message::operator<<(pMVar3,local_48);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x21a732);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x218f64);
    __s = TestProperty::value(local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
    EscapeXmlAttribute(&local_68,&local_88);
    pMVar3 = Message::operator<<(pMVar3,&local_68);
    Message::operator<<(pMVar3,(char (*) [2])0x218f64);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    property._4_4_ = property._4_4_ + 1;
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&stack0xffffffffffffffe0);
  Message::~Message((Message *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}